

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

string * __thiscall
RtMidi::getApiDisplayName_abi_cxx11_(string *__return_storage_ptr__,RtMidi *this,Api api)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((uint)this < 6) {
    __s = rtmidi_api_names[(ulong)this & 0xffffffff][1];
    __a = &local_a;
  }
  else {
    __s = "Unknown";
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string RtMidi :: getApiDisplayName( RtMidi::Api api )
{
  if (api < 0 || api >= RtMidi::NUM_APIS)
    return "Unknown";
  return rtmidi_api_names[api][1];
}